

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImFontGlyphRangesBuilder::BuildRanges
          (ImFontGlyphRangesBuilder *this,ImVector<unsigned_short> *out_ranges)

{
  int iVar1;
  unsigned_short *puVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  
  uVar6 = 0;
  do {
    if (((int)uVar6 >> 5 < 0) || (*(int *)this <= (int)uVar6 >> 5)) {
LAB_001a6f90:
      __assert_fail("i >= 0 && i < Size",
                    "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/imgui.h"
                    ,0x645,
                    "const T &ImVector<unsigned int>::operator[](int) const [T = unsigned int]");
    }
    uVar7 = uVar6;
    if ((*(uint *)(*(long *)(this + 8) + (ulong)(uVar6 >> 5) * 4) >> (uVar6 & 0x1f) & 1) != 0) {
      iVar3 = out_ranges->Size;
      if (iVar3 == out_ranges->Capacity) {
        if (iVar3 == 0) {
          iVar1 = 8;
        }
        else {
          iVar1 = iVar3 / 2 + iVar3;
        }
        iVar5 = iVar3 + 1;
        if (iVar3 + 1 < iVar1) {
          iVar5 = iVar1;
        }
        puVar2 = (unsigned_short *)ImGui::MemAlloc((long)iVar5 * 2);
        if (out_ranges->Data != (unsigned_short *)0x0) {
          memcpy(puVar2,out_ranges->Data,(long)out_ranges->Size * 2);
          ImGui::MemFree(out_ranges->Data);
        }
        out_ranges->Data = puVar2;
        out_ranges->Capacity = iVar5;
        iVar3 = out_ranges->Size;
      }
      else {
        puVar2 = out_ranges->Data;
      }
      uVar4 = (ulong)uVar6;
      puVar2[iVar3] = (unsigned_short)uVar6;
      iVar1 = out_ranges->Size;
      iVar3 = iVar1 + 1;
      out_ranges->Size = iVar3;
      uVar7 = uVar6 - 1;
      do {
        if (0xfffe < uVar4) {
          uVar7 = 0xffff;
          break;
        }
        uVar4 = uVar4 + 1;
        if (*(int *)this <= (int)((uint)(uVar4 >> 5) & 0x7ffffff)) goto LAB_001a6f90;
        uVar7 = uVar7 + 1;
      } while ((*(uint *)(*(long *)(this + 8) + (uVar4 >> 5) * 4) >> ((uint)uVar4 & 0x1f) & 1) != 0)
      ;
      if (iVar3 == out_ranges->Capacity) {
        if (iVar3 == 0) {
          iVar3 = 8;
        }
        else {
          iVar3 = iVar3 / 2 + iVar3;
        }
        iVar1 = iVar1 + 2;
        if (iVar1 < iVar3) {
          iVar1 = iVar3;
        }
        puVar2 = (unsigned_short *)ImGui::MemAlloc((long)iVar1 * 2);
        if (out_ranges->Data != (unsigned_short *)0x0) {
          memcpy(puVar2,out_ranges->Data,(long)out_ranges->Size * 2);
          ImGui::MemFree(out_ranges->Data);
        }
        out_ranges->Data = puVar2;
        out_ranges->Capacity = iVar1;
        iVar3 = out_ranges->Size;
      }
      else {
        puVar2 = out_ranges->Data;
      }
      puVar2[iVar3] = (unsigned_short)uVar7;
      out_ranges->Size = out_ranges->Size + 1;
    }
    uVar6 = uVar7 + 1;
    if (0xfffe < (int)uVar7) {
      iVar3 = out_ranges->Size;
      if (iVar3 == out_ranges->Capacity) {
        if (iVar3 == 0) {
          iVar1 = 8;
        }
        else {
          iVar1 = iVar3 / 2 + iVar3;
        }
        iVar5 = iVar3 + 1;
        if (iVar3 + 1 < iVar1) {
          iVar5 = iVar1;
        }
        puVar2 = (unsigned_short *)ImGui::MemAlloc((long)iVar5 * 2);
        if (out_ranges->Data != (unsigned_short *)0x0) {
          memcpy(puVar2,out_ranges->Data,(long)out_ranges->Size * 2);
          ImGui::MemFree(out_ranges->Data);
        }
        out_ranges->Data = puVar2;
        out_ranges->Capacity = iVar5;
        iVar3 = out_ranges->Size;
      }
      else {
        puVar2 = out_ranges->Data;
      }
      puVar2[iVar3] = 0;
      out_ranges->Size = out_ranges->Size + 1;
      return;
    }
  } while( true );
}

Assistant:

void ImFontGlyphRangesBuilder::BuildRanges(ImVector<ImWchar>* out_ranges)
{
    const int max_codepoint = IM_UNICODE_CODEPOINT_MAX;
    for (int n = 0; n <= max_codepoint; n++)
        if (GetBit(n))
        {
            out_ranges->push_back((ImWchar)n);
            while (n < max_codepoint && GetBit(n + 1))
                n++;
            out_ranges->push_back((ImWchar)n);
        }
    out_ranges->push_back(0);
}